

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_str_repeat(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zString;
  int nLen;
  int local_2c;
  
  if ((nArg < 2) || (zString = jx9_value_to_string(*apArg,&local_2c), local_2c < 1)) {
    jx9_result_null(pCtx);
  }
  else {
    iVar1 = jx9_value_to_int(apArg[1]);
    if (iVar1 < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      for (; 0 < iVar1; iVar1 = iVar1 + -1) {
        jx9_result_string(pCtx,zString,local_2c);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_repeat(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen, nMul;
	int rc;
	if( nArg < 2 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string.Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the multiplier */
	nMul = jx9_value_to_int(apArg[1]);
	if( nMul < 1 ){
		/* Return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( nMul < 1 ){
			break;
		}
		/* Append the copy */
		rc = jx9_result_string(pCtx, zIn, nLen);
		if( rc != JX9_OK ){
			/* Out of memory, break immediately */
			break;
		}
		nMul--;
	}
	return JX9_OK;
}